

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletocsv.cpp
# Opt level: O2

void ensembletocsv::doit(void)

{
  size_t sVar1;
  Ensemble q;
  
  puts("sidx, ensemble_id");
  sVar1 = fread(&q,8,1,_stdin);
  while (sVar1 != 0) {
    printf("%d, %d\n",(ulong)(uint)q.sidx,(ulong)(uint)q.ensemble_id);
    sVar1 = fread(&q,8,1,_stdin);
  }
  return;
}

Assistant:

void doit() {

    printf("sidx, ensemble_id\n");

    Ensemble q;
    size_t i = fread(&q, sizeof(q), 1, stdin);
    while (i != 0) {
      printf("%d, %d\n", q.sidx, q.ensemble_id);
      i = fread(&q, sizeof(q), 1, stdin);
    }

  }